

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O0

void __thiscall helics::apps::BrokerServer::BrokerServer(BrokerServer *this,string_view configFile)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type in_stack_00001358;
  undefined8 in_stack_ffffffffffffff88;
  atomic<bool> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  allocator<char> local_19 [25];
  
  *(undefined1 *)&(in_RDI->_M_dataplus)._M_p = 0;
  *(undefined1 *)((long)&(in_RDI->_M_dataplus)._M_p + 1) = 0;
  *(undefined1 *)((long)&(in_RDI->_M_dataplus)._M_p + 2) = 0;
  *(undefined1 *)((long)&(in_RDI->_M_dataplus)._M_p + 3) = 0;
  *(undefined1 *)((long)&(in_RDI->_M_dataplus)._M_p + 4) = 0;
  *(undefined1 *)((long)&(in_RDI->_M_dataplus)._M_p + 5) = 0;
  CLI::std::atomic<bool>::atomic
            (in_stack_ffffffffffffff90,SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0));
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &in_RDI->_M_string_length;
  CLI::std::
  vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ::vector((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
            *)0x1e7a42);
  this_01 = in_RDI + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator(local_19);
  gmlc::utilities::randomString_abi_cxx11_(in_stack_00001358);
  std::operator+(in_RDI,(char *)this_00);
  std::__cxx11::string::~string(this_00);
  std::unique_ptr<helics::fileops::JsonStorage,std::default_delete<helics::fileops::JsonStorage>>::
  unique_ptr<std::default_delete<helics::fileops::JsonStorage>,void>
            ((unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
              *)this_00);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  return;
}

Assistant:

BrokerServer::BrokerServer(std::string_view configFile):
    configFile_(configFile), server_name_{gmlc::utilities::randomString(5) + "_broker_server"}
{
}